

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayoutPrivate::~QBoxLayoutPrivate(QBoxLayoutPrivate *this)

{
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QBoxLayoutPrivate_007bf788;
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&(this->geomArray).d);
  QArrayDataPointer<QBoxLayoutItem_*>::~QArrayDataPointer(&(this->list).d);
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

QBoxLayoutPrivate::~QBoxLayoutPrivate()
{
}